

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KNNValidatorTests.cpp
# Opt level: O2

int testLabelTypeMismatchTest(void)

{
  bool bVar1;
  KNearestNeighborsClassifier *nnModel;
  NearestNeighborsIndex *this;
  SingleKdTreeIndex *pSVar2;
  ostream *poVar3;
  ostream *this_00;
  int iVar4;
  char *pcVar5;
  undefined1 local_a0 [40];
  Result res;
  Model m1;
  
  CoreML::Specification::Model::Model(&m1);
  CoreML::KNNValidatorTests::generateInterface(&m1);
  nnModel = CoreML::Specification::Model::mutable_knearestneighborsclassifier(&m1);
  CoreML::KNNValidatorTests::setNumberOfNeighbors(nnModel,3,true);
  CoreML::Specification::KNearestNeighborsClassifier::mutable_uniformweighting(nnModel);
  this = CoreML::Specification::KNearestNeighborsClassifier::mutable_nearestneighborsindex(nnModel);
  CoreML::Specification::NearestNeighborsIndex::mutable_squaredeuclideandistance(this);
  pSVar2 = CoreML::Specification::NearestNeighborsIndex::mutable_singlekdtreeindex(this);
  pSVar2->leafsize_ = 0x1e;
  CoreML::validate<(MLModelType)404>(&res,&m1);
  bVar1 = CoreML::Result::good(&res);
  if (bVar1) {
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/KNNValidatorTests.cpp"
                            );
    this_00 = (ostream *)std::operator<<(poVar3,":");
    iVar4 = 0x19f;
LAB_00135cc1:
    poVar3 = (ostream *)std::ostream::operator<<(this_00,iVar4);
    poVar3 = std::operator<<(poVar3,": error: ");
    pcVar5 = "!((res).good())";
  }
  else {
    CoreML::Specification::KNearestNeighborsClassifier::set_defaultstringlabel(nnModel,"Default");
    CoreML::validate<(MLModelType)404>((Result *)local_a0,&m1);
    CoreML::Result::operator=(&res,(Result *)local_a0);
    std::__cxx11::string::~string((string *)(local_a0 + 8));
    bVar1 = CoreML::Result::good(&res);
    if (bVar1) {
      CoreML::Specification::KNearestNeighborsClassifier::mutable_int64classlabels(nnModel);
      CoreML::validate<(MLModelType)404>((Result *)local_a0,&m1);
      CoreML::Result::operator=(&res,(Result *)local_a0);
      std::__cxx11::string::~string((string *)(local_a0 + 8));
      bVar1 = CoreML::Result::good(&res);
      iVar4 = 0;
      if (!bVar1) goto LAB_00135e01;
      poVar3 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/KNNValidatorTests.cpp"
                              );
      this_00 = (ostream *)std::operator<<(poVar3,":");
      iVar4 = 0x1ab;
      goto LAB_00135cc1;
    }
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/KNNValidatorTests.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x1a5);
    poVar3 = std::operator<<(poVar3,": error: ");
    pcVar5 = "(res).good()";
  }
  poVar3 = std::operator<<(poVar3,pcVar5);
  poVar3 = std::operator<<(poVar3," was false, expected true.");
  std::endl<char,std::char_traits<char>>(poVar3);
  iVar4 = 1;
LAB_00135e01:
  std::__cxx11::string::~string((string *)&res.m_message);
  CoreML::Specification::Model::~Model(&m1);
  return iVar4;
}

Assistant:

int testLabelTypeMismatchTest() {
    
    Specification::Model m1;
    
    KNNValidatorTests::generateInterface(m1);
    
    auto *knnClassifier = m1.mutable_knearestneighborsclassifier();
    KNNValidatorTests::setNumberOfNeighbors(knnClassifier, 3, true);
    knnClassifier->mutable_uniformweighting();
    
    auto *nnIndex = knnClassifier->mutable_nearestneighborsindex();
    nnIndex->mutable_squaredeuclideandistance();
    auto *kdTree = nnIndex->mutable_singlekdtreeindex();
    kdTree->set_leafsize(30);
    
    // Validation should fail since we are not telling the label type.
    Result res = validate<MLModelType_kNearestNeighborsClassifier>(m1);
    ML_ASSERT_BAD(res);
    
    knnClassifier->set_defaultstringlabel("Default");
    
    // Validation should pass now.
    res = validate<MLModelType_kNearestNeighborsClassifier>(m1);
    ML_ASSERT_GOOD(res);
    
    knnClassifier->mutable_int64classlabels();
    
    // Validation should fail due to mismatch in type
    res = validate<MLModelType_kNearestNeighborsClassifier>(m1);
    ML_ASSERT_BAD(res);
    
    return 0;
    
}